

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

ParsedSchema __thiscall capnp::ParsedSchema::getNested(ParsedSchema *this,StringPtr nestedName)

{
  ParsedSchema PVar1;
  Fault f;
  StringPtr nestedName_local;
  undefined1 local_50 [48];
  ArrayPtr<const_char> local_20;
  
  nestedName_local.content.size_ = nestedName.content.size_;
  nestedName_local.content.ptr = nestedName.content.ptr;
  findNested((Maybe<capnp::ParsedSchema> *)local_50,this,nestedName);
  if (local_50[0] == true) {
    PVar1.super_Schema.raw = (RawBrandedSchema *)local_50._8_8_;
    PVar1.parser = (SchemaParser *)local_50._16_8_;
    return PVar1;
  }
  Schema::getProto((Reader *)local_50,&this->super_Schema);
  local_20 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_50);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,char_const(&)[27],capnp::Text::Reader,kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
             ,0x147,FAILED,(char *)0x0,
             "\"no such nested declaration\", getProto().getDisplayName(), nestedName",
             (char (*) [27])"no such nested declaration",(Reader *)&local_20,&nestedName_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

ParsedSchema ParsedSchema::getNested(kj::StringPtr nestedName) const {
  KJ_IF_MAYBE(nested, findNested(nestedName)) {
    return *nested;
  } else {
    KJ_FAIL_REQUIRE("no such nested declaration", getProto().getDisplayName(), nestedName);
  }
}